

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSatEdge.c
# Opt level: O3

Vec_Int_t * Seg_ManCountIntEdges(Gia_Man_t *p,Vec_Int_t *vPolars,Vec_Int_t *vToSkip,int nFanouts)

{
  int iVar1;
  Vec_Int_t *p_00;
  int *piVar2;
  Vec_Int_t *pVVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  
  p_00 = (Vec_Int_t *)malloc(0x10);
  p_00->nCap = 1000;
  p_00->nSize = 0;
  piVar2 = (int *)malloc(4000);
  p_00->pArray = piVar2;
  if (p->vMapping == (Vec_Int_t *)0x0) {
    __assert_fail("Gia_ManHasMapping(p)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaSatEdge.c"
                  ,0x53,
                  "Vec_Int_t *Seg_ManCountIntEdges(Gia_Man_t *, Vec_Int_t *, Vec_Int_t *, int)");
  }
  vPolars->nSize = 0;
  vToSkip->nSize = 0;
  if (nFanouts != 0) {
    Gia_ManSetLutRefs(p);
  }
  iVar4 = p->nObjs;
  if (1 < iVar4) {
    pVVar3 = p->vMapping;
    lVar8 = 1;
    do {
      if (pVVar3->nSize <= lVar8) {
LAB_00750462:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                      ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      if (pVVar3->pArray[lVar8] != 0) {
        lVar5 = (long)pVVar3->nSize;
        if (lVar5 <= lVar8) goto LAB_00750462;
        lVar7 = 0;
        while( true ) {
          piVar2 = pVVar3->pArray;
          lVar6 = (long)piVar2[lVar8];
          if ((lVar6 < 0) || ((uint)lVar5 <= (uint)piVar2[lVar8])) goto LAB_00750462;
          if (piVar2[lVar6] <= lVar7) break;
          iVar4 = piVar2[lVar6 + lVar7 + 1];
          lVar5 = (long)iVar4;
          if ((lVar5 < 0) || (p->nObjs <= iVar4)) {
            __assert_fail("v >= 0 && v < p->nObjs",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                          ,0x1af,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
          }
          if ((~*(uint *)(p->pObjs + lVar5) & 0x1fffffff) != 0 &&
              -1 < (int)*(uint *)(p->pObjs + lVar5)) {
            if ((p->vEdge1 != (Vec_Int_t *)0x0) &&
               (iVar1 = Gia_ObjCheckEdge(p,iVar4,(int)lVar8), iVar1 != 0)) {
              Vec_IntPush(vPolars,p_00->nSize / 2);
            }
            if (nFanouts != 0) {
              if (p->pLutRefs == (int *)0x0) {
                __assert_fail("p->pLutRefs",
                              "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                              ,0x233,"int Gia_ObjLutRefNumId(Gia_Man_t *, int)");
              }
              if (nFanouts <= p->pLutRefs[lVar5]) {
                Vec_IntPush(vToSkip,p_00->nSize / 2);
              }
            }
            Vec_IntPush(p_00,iVar4);
            Vec_IntPush(p_00,(int)lVar8);
            pVVar3 = p->vMapping;
          }
          lVar7 = lVar7 + 1;
          lVar5 = (long)pVVar3->nSize;
          if (lVar5 <= lVar8) goto LAB_00750462;
        }
        iVar4 = p->nObjs;
      }
      lVar8 = lVar8 + 1;
    } while (lVar8 < iVar4);
  }
  if ((nFanouts != 0) && (p->pLutRefs != (int *)0x0)) {
    free(p->pLutRefs);
    p->pLutRefs = (int *)0x0;
  }
  return p_00;
}

Assistant:

Vec_Int_t * Seg_ManCountIntEdges( Gia_Man_t * p, Vec_Int_t * vPolars, Vec_Int_t * vToSkip, int nFanouts )
{
    int i, iLut, iFanin;
    Vec_Int_t * vEdges = Vec_IntAlloc( 1000 );
    assert( Gia_ManHasMapping(p) );
    Vec_IntClear( vPolars );
    Vec_IntClear( vToSkip );
    if ( nFanouts )
        Gia_ManSetLutRefs( p );
    Gia_ManForEachLut( p, iLut )
        Gia_LutForEachFanin( p, iLut, iFanin, i )
            if ( Gia_ObjIsAnd(Gia_ManObj(p, iFanin)) )
            {
                if ( p->vEdge1 && Gia_ObjCheckEdge(p, iFanin, iLut) )
                    Vec_IntPush( vPolars, Vec_IntSize(vEdges)/2 );
                if ( nFanouts && Gia_ObjLutRefNumId(p, iFanin) >= nFanouts )
                    Vec_IntPush( vToSkip, Vec_IntSize(vEdges)/2 );
                Vec_IntPushTwo( vEdges, iFanin, iLut );
            }
    if ( nFanouts )
        ABC_FREE( p->pLutRefs );
    return vEdges;
}